

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O0

void __thiscall ki::dml::Field<int>::~Field(Field<int> *this)

{
  Field<int> *this_local;
  
  ~Field(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~Field() = default;